

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::torrent::load_merkle_trees
          (torrent *this,vector<std::vector<sha256_hash>,_file_index_t> *trees_import,
          vector<bitfield,_file_index_t> *mask,vector<bitfield,_file_index_t> *verified)

{
  bool bVar1;
  element_type *this_00;
  file_storage *this_01;
  int64_t iVar2;
  value_type *pvVar3;
  size_t sVar4;
  value_type *pvVar5;
  value_type *pvVar6;
  byte local_10e;
  value_type *local_100;
  span<const_libtorrent::digest32<256L>_> local_b0;
  int local_9c;
  int local_98;
  int local_94;
  span<const_libtorrent::digest32<256L>_> local_90;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> local_6c;
  int local_68;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> local_64;
  value_type *local_60;
  bitfield *verified_bitmask;
  int local_50;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> local_40;
  file_index_t local_3c;
  file_index_t i;
  bitfield empty_verified;
  file_storage *fs;
  vector<bitfield,_file_index_t> *verified_local;
  vector<bitfield,_file_index_t> *mask_local;
  vector<std::vector<sha256_hash>,_file_index_t> *trees_import_local;
  torrent *this_local;
  
  this_00 = ::std::
            __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&(this->super_torrent_hot_members).m_torrent_file);
  this_01 = torrent_info::orig_files(this_00);
  bitfield::bitfield((bitfield *)&stack0xffffffffffffffc8);
  memset(&local_3c,0,4);
  while( true ) {
    local_40.m_val = (int)file_storage::end_file(this_01);
    bVar1 = strong_typedef<int,_libtorrent::aux::file_index_tag,_void>::operator<
                      (&local_3c,&local_40);
    if (!bVar1) break;
    local_50 = local_3c.m_val;
    bVar1 = file_storage::pad_file_at(this_01,local_3c);
    if (!bVar1) {
      verified_bitmask._4_4_ = local_3c.m_val;
      iVar2 = file_storage::file_size(this_01,local_3c);
      if (iVar2 != 0) {
        verified_bitmask._0_4_ =
             container_wrapper<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>_>
             ::end_index(trees_import);
        bVar1 = strong_typedef<int,_libtorrent::aux::file_index_tag,_void>::operator>=
                          (&local_3c,
                           (strong_typedef<int,_libtorrent::aux::file_index_tag,_void> *)
                           &verified_bitmask);
        if (bVar1) break;
        local_64 = container_wrapper<libtorrent::bitfield,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>_>
                   ::end_index(verified);
        bVar1 = strong_typedef<int,_libtorrent::aux::file_index_tag,_void>::operator>=
                          (&local_3c,&local_64);
        if (bVar1) {
          local_100 = (value_type *)&stack0xffffffffffffffc8;
        }
        else {
          local_68 = local_3c.m_val;
          local_100 = container_wrapper<libtorrent::bitfield,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>_>
                      ::operator[](verified,(strong_typedef<int,_libtorrent::aux::file_index_tag,_void>
                                             )local_3c.m_val);
        }
        local_60 = local_100;
        local_6c = container_wrapper<libtorrent::bitfield,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>_>
                   ::end_index(mask);
        bVar1 = strong_typedef<int,_libtorrent::aux::file_index_tag,_void>::operator<
                          (&local_3c,&local_6c);
        local_10e = 0;
        if (bVar1) {
          local_70 = local_3c.m_val;
          pvVar3 = container_wrapper<libtorrent::bitfield,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>_>
                   ::operator[](mask,(strong_typedef<int,_libtorrent::aux::file_index_tag,_void>)
                                     local_3c.m_val);
          bVar1 = bitfield::empty(pvVar3);
          local_10e = bVar1 ^ 0xff;
        }
        if ((local_10e & 1) == 0) {
          local_9c = local_3c.m_val;
          pvVar5 = container_wrapper<libtorrent::aux::merkle_tree,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>_>
                   ::operator[](&this->m_merkle_trees,
                                (strong_typedef<int,_libtorrent::aux::file_index_tag,_void>)
                                local_3c.m_val);
          pvVar6 = container_wrapper<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>_>
                   ::operator[](trees_import,
                                (strong_typedef<int,_libtorrent::aux::file_index_tag,_void>)
                                local_3c.m_val);
          span<libtorrent::digest32<256l>const>::
          span<std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>,libtorrent::digest32<256l>,void>
                    ((span<libtorrent::digest32<256l>const> *)&local_b0,pvVar6);
          merkle_tree::load_tree(pvVar5,local_b0,local_60);
        }
        else {
          local_74 = local_3c.m_val;
          pvVar3 = container_wrapper<libtorrent::bitfield,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>_>
                   ::operator[](mask,(strong_typedef<int,_libtorrent::aux::file_index_tag,_void>)
                                     local_3c.m_val);
          local_78 = local_3c.m_val;
          pvVar5 = container_wrapper<libtorrent::aux::merkle_tree,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>_>
                   ::operator[](&this->m_merkle_trees,
                                (strong_typedef<int,_libtorrent::aux::file_index_tag,_void>)
                                local_3c.m_val);
          sVar4 = merkle_tree::size(pvVar5);
          bitfield::resize(pvVar3,(int)sVar4);
          local_7c = local_3c.m_val;
          pvVar5 = container_wrapper<libtorrent::aux::merkle_tree,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>_>
                   ::operator[](&this->m_merkle_trees,
                                (strong_typedef<int,_libtorrent::aux::file_index_tag,_void>)
                                local_3c.m_val);
          local_94 = local_3c.m_val;
          pvVar6 = container_wrapper<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>_>
                   ::operator[](trees_import,
                                (strong_typedef<int,_libtorrent::aux::file_index_tag,_void>)
                                local_3c.m_val);
          span<libtorrent::digest32<256l>const>::
          span<std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>,libtorrent::digest32<256l>,void>
                    ((span<libtorrent::digest32<256l>const> *)&local_90,pvVar6);
          local_98 = local_3c.m_val;
          pvVar3 = container_wrapper<libtorrent::bitfield,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>_>
                   ::operator[](mask,(strong_typedef<int,_libtorrent::aux::file_index_tag,_void>)
                                     local_3c.m_val);
          merkle_tree::load_sparse_tree(pvVar5,local_90,pvVar3,local_60);
        }
      }
    }
    strong_typedef<int,_libtorrent::aux::file_index_tag,_void>::operator++(&local_3c);
  }
  bitfield::~bitfield((bitfield *)&stack0xffffffffffffffc8);
  return;
}

Assistant:

void torrent::load_merkle_trees(
		aux::vector<std::vector<sha256_hash>, file_index_t> trees_import
		, aux::vector<bitfield, file_index_t> mask
		, aux::vector<bitfield, file_index_t> verified)
	{
		auto const& fs = m_torrent_file->orig_files();

		bitfield const empty_verified;
		for (file_index_t i{0}; i < fs.end_file(); ++i)
		{
			if (fs.pad_file_at(i) || fs.file_size(i) == 0)
				continue;

			if (i >= trees_import.end_index()) break;
			bitfield const& verified_bitmask = (i >= verified.end_index()) ? empty_verified : verified[i];
			if (i < mask.end_index() && !mask[i].empty())
			{
				mask[i].resize(int(m_merkle_trees[i].size()));
				m_merkle_trees[i].load_sparse_tree(trees_import[i], mask[i], verified_bitmask);
			}
			else
			{
				m_merkle_trees[i].load_tree(trees_import[i], verified_bitmask);
			}
		}
	}